

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  char *pcVar4;
  Nonnull<const_char_*> failure_msg;
  char *pcVar5;
  int iVar6;
  int iVar7;
  LogMessageFatal LStack_38;
  
  iVar7 = this->depth_;
  iVar6 = iVar7 + -1;
  this->depth_ = iVar6;
  if (iVar7 < 1) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar7 = this->group_depth_ + 1;
    this->group_depth_ = iVar7;
    pcVar4 = MessageLite::_InternalParse(msg,ptr,this);
    if (pcVar4 != (char *)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar6,this->depth_,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar6 = 0x24c;
LAB_00241e37:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar6,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
      }
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar7,this->group_depth_,"old_group_depth == group_depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar6 = 0x24d;
        goto LAB_00241e37;
      }
    }
    uVar1 = this->depth_;
    uVar2 = this->group_depth_;
    this->depth_ = uVar1 + 1;
    this->group_depth_ = uVar2 + -1;
    uVar3 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar5 = (char *)0x0;
    if (uVar3 == tag) {
      pcVar5 = pcVar4;
    }
  }
  return pcVar5;
}

Assistant:

[[nodiscard]] PROTOBUF_NDEBUG_INLINE const char* ParseGroup(MessageLite* msg,
                                                              const char* ptr,
                                                              uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (ABSL_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }